

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O2

void TTD::NSLogEvents::JsRTCallFunctionAction_ProcessArgs
               (EventLogEntry *evt,int32 rootDepth,int64 callEventTime,Var funcVar,uint32 argc,
               Var *argv,int64 topLevelCallbackEventTime,UnlinkableSlabAllocator *alloc)

{
  JsRTCallFunctionAction *pJVar1;
  void **ppvVar2;
  
  pJVar1 = GetInlineEventDataAs<TTD::NSLogEvents::JsRTCallFunctionAction,(TTD::NSLogEvents::EventKind)68>
                     (evt);
  pJVar1->CallbackDepth = rootDepth;
  pJVar1->ArgCount = argc + 1;
  ppvVar2 = SlabAllocatorBase<8>::SlabAllocateArray<void*>(alloc,(ulong)(argc + 1));
  pJVar1->ArgArray = ppvVar2;
  *ppvVar2 = funcVar;
  js_memcpy_s(pJVar1->ArgArray + 1,(ulong)(pJVar1->ArgCount - 1) << 3,argv,(ulong)argc << 3);
  pJVar1->CallEventTime = callEventTime;
  pJVar1->TopLevelCallbackEventTime = topLevelCallbackEventTime;
  pJVar1->AdditionalReplayInfo = (JsRTCallFunctionAction_ReplayAdditionalInfo *)0x0;
  return;
}

Assistant:

void JsRTCallFunctionAction_ProcessArgs(EventLogEntry* evt, int32 rootDepth, int64 callEventTime, Js::Var funcVar, uint32 argc, Js::Var* argv, int64 topLevelCallbackEventTime, UnlinkableSlabAllocator& alloc)
        {
            JsRTCallFunctionAction* cfAction = GetInlineEventDataAs<JsRTCallFunctionAction, EventKind::CallExistingFunctionActionTag>(evt);

            cfAction->CallbackDepth = rootDepth;
            cfAction->ArgCount = argc + 1;

            static_assert(sizeof(TTDVar) == sizeof(Js::Var), "These need to be the same size (and have same bit layout) for this to work!");

            cfAction->ArgArray = alloc.SlabAllocateArray<TTDVar>(cfAction->ArgCount);
            cfAction->ArgArray[0] = TTD_CONVERT_JSVAR_TO_TTDVAR(funcVar);
            js_memcpy_s(cfAction->ArgArray + 1, (cfAction->ArgCount -1) * sizeof(TTDVar), argv, argc * sizeof(Js::Var));

            cfAction->CallEventTime = callEventTime;

            cfAction->TopLevelCallbackEventTime = topLevelCallbackEventTime;

            cfAction->AdditionalReplayInfo = nullptr;

            //Result is initialized when we register this with the popper
        }